

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.cpp
# Opt level: O1

ByteBlock * Js::ByteBlock::New(Recycler *alloc,byte *initialContent,int initialContentSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc_00;
  ByteBlock *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (initialContentSize < 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteBlock.cpp"
                                ,0x29,"(initialContentSize > 0)","Must have valid data size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_3530231;
  data.filename._0_4_ = 0x2b;
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_50);
  this = (ByteBlock *)new<Memory::Recycler>(0x10,alloc_00,0x38bbb2);
  ByteBlock(this,initialContentSize,alloc);
  if (initialContent != (byte *)0x0) {
    js_memcpy_s((this->m_content).ptr,(ulong)this->m_contentSize,initialContent,
                (long)initialContentSize);
  }
  return this;
}

Assistant:

ByteBlock *ByteBlock::New(Recycler *alloc, const byte * initialContent, int initialContentSize)
    {
        // initialContent may be 'null' if no data to copy
        AssertMsg(initialContentSize > 0, "Must have valid data size");

        ByteBlock *newBlock = RecyclerNew(alloc, ByteBlock, initialContentSize, alloc);

        //
        // Copy any optional data into the block:
        // - If initialContent was not provided, the block's contents will be uninitialized.
        //
        if (initialContent != nullptr)
        {
            js_memcpy_s(newBlock->m_content, newBlock->GetLength(), initialContent, initialContentSize);
        }

        return newBlock;
    }